

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsViewPrivate::centerView(QGraphicsViewPrivate *this,ViewportAnchor anchor)

{
  QGraphicsView *this_00;
  QWidget *this_01;
  undefined8 uVar1;
  long in_FS_OFFSET;
  QPointF QVar2;
  QPointF QVar3;
  QRect QVar4;
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if (anchor == AnchorViewCenter) {
LAB_005b910c:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QGraphicsView::centerOn(this_00,&this->lastCenterPoint);
      return;
    }
  }
  else {
    if (anchor == AnchorUnderMouse) {
      if ((*(byte *)(*(long *)(this_00 + 0x20) + 8) & 2) == 0) goto LAB_005b910c;
      QVar4 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
      local_38.xp = (double)(((long)QVar4.x2.m_i.m_i - (long)QVar4.x1.m_i.m_i) + 1) * 0.5 +
                    (double)QVar4.x1.m_i.m_i;
      local_38.yp = (double)(((QVar4._8_8_ >> 0x20) - (QVar4._0_8_ >> 0x20)) + 1) * 0.5 +
                    (double)QVar4.y1.m_i.m_i;
      QVar2 = mapToScene(this,&local_38);
      this_01 = (this->super_QAbstractScrollAreaPrivate).viewport;
      uVar1 = QCursor::pos();
      local_58.xp = (qreal)(int)uVar1;
      local_58.yp = (qreal)(int)((ulong)uVar1 >> 0x20);
      local_48 = QWidget::mapFromGlobal(this_01,&local_58);
      QVar3 = mapToScene(this,&local_48);
      local_38.xp = (this->lastMouseMoveScenePoint).xp + (QVar2.xp - QVar3.xp);
      local_38.yp = (this->lastMouseMoveScenePoint).yp + (QVar2.yp - QVar3.yp);
      QGraphicsView::centerOn(this_00,&local_38);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::centerView(QGraphicsView::ViewportAnchor anchor)
{
    Q_Q(QGraphicsView);
    switch (anchor) {
    case QGraphicsView::AnchorUnderMouse: {
        if (q->underMouse()) {
            // Last scene pos: lastMouseMoveScenePoint
            // Current mouse pos:
            QPointF transformationDiff = mapToScene(viewport->rect().toRectF().center())
                                         - mapToScene(viewport->mapFromGlobal(QCursor::pos().toPointF()));
            q->centerOn(lastMouseMoveScenePoint + transformationDiff);
        } else {
            q->centerOn(lastCenterPoint);
        }
        break;
    }
    case QGraphicsView::AnchorViewCenter:
        q->centerOn(lastCenterPoint);
        break;
    case QGraphicsView::NoAnchor:
        break;
    }
}